

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O0

string * __thiscall
Test::Output::stripMethodName(string *__return_storage_ptr__,Output *this,string *methodName)

{
  size_type __pos;
  const_reference pvVar1;
  size_type local_28;
  size_t pos;
  string *methodName_local;
  Output *this_local;
  
  local_28 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                       (methodName);
  do {
    __pos = local_28;
    local_28 = __pos - 1;
    if (local_28 == 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,methodName);
      return __return_storage_ptr__;
    }
    pvVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](methodName,local_28);
  } while (*pvVar1 != ':');
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (__return_storage_ptr__,methodName,__pos,0xffffffffffffffff);
  return __return_storage_ptr__;
}

Assistant:

std::string Output::stripMethodName(const std::string &methodName) const {
  std::size_t pos = methodName.size() - 1;
  while (pos > 0) {
    if (methodName[pos] == ':')
      return methodName.substr(pos + 1);
    --pos;
  }
  return methodName;
}